

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrCex.c
# Opt level: O1

Abc_Cex_t *
Aig_ManVerifyUsingBddsCountExample
          (Aig_Man_t *p,DdManager *dd,DdNode **pbParts,Vec_Ptr_t *vOnionRings,DdNode *bCubeFirst,
          int iOutput,int fVerbose,int fSilent)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Abc_Cex_t *p_00;
  DdNode *pDVar5;
  Bbr_ImageTree_t *pTree;
  char *string;
  DdNode *n;
  uint uVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  DdNode *pDVar10;
  long local_50;
  timespec ts;
  
  iVar2 = clock_gettime(3,(timespec *)&ts);
  if (iVar2 < 0) {
    local_50 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    local_50 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  p_00 = Abc_CexAlloc(p->nRegs,p->nTruePis,vOnionRings->nSize + 1);
  iVar2 = vOnionRings->nSize;
  p_00->iFrame = iVar2;
  p_00->iPo = iOutput;
  iVar3 = p->nRegs;
  iVar4 = p->nTruePis;
  iVar8 = iVar4 + iVar3;
  pDVar5 = Bbr_bddComputeRangeCube(dd,iVar8,iVar8 + iVar3);
  Cudd_Ref(pDVar5);
  pTree = Bbr_bddImageStart(dd,pDVar5,p->nRegs,pbParts,p->nTruePis + p->nRegs,dd->vars,100000000,
                            fVerbose);
  Cudd_RecursiveDeref(dd,pDVar5);
  if (pTree == (Bbr_ImageTree_t *)0x0) {
    if (fSilent != 0) {
      return (Abc_Cex_t *)0x0;
    }
    printf("BDDs blew up during qualitification scheduling.  ");
    return (Abc_Cex_t *)0x0;
  }
  string = (char *)malloc((long)dd->size);
  iVar8 = Cudd_bddPickOneCube(dd,bCubeFirst,string);
  if (iVar8 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/bbr/bbrCex.c"
                  ,0x53,
                  "Abc_Cex_t *Aig_ManVerifyUsingBddsCountExample(Aig_Man_t *, DdManager *, DdNode **, Vec_Ptr_t *, DdNode *, int, int, int)"
                 );
  }
  iVar3 = iVar4 * iVar2 + iVar3;
  iVar2 = p->nTruePis;
  if (0 < iVar2) {
    pVVar1 = p->vCis;
    lVar7 = 0;
    do {
      if (pVVar1->nSize <= lVar7) goto LAB_00920ac6;
      if (string[lVar7] == '\x01') {
        iVar2 = iVar3 + (int)lVar7;
        (&p_00[1].iPo)[iVar2 >> 5] = (&p_00[1].iPo)[iVar2 >> 5] | 1 << ((byte)iVar2 & 0x1f);
      }
      lVar7 = lVar7 + 1;
      iVar2 = p->nTruePis;
    } while (lVar7 < iVar2);
  }
  pDVar5 = dd->one;
  Cudd_Ref(pDVar5);
  iVar4 = p->nRegs;
  if (0 < iVar4) {
    iVar8 = 0;
    pDVar10 = pDVar5;
    do {
      uVar6 = iVar8 + p->nTruePis;
      if (((int)uVar6 < 0) || (p->vCis->nSize <= (int)uVar6)) goto LAB_00920ac6;
      pDVar5 = Cudd_bddAnd(dd,pDVar10,
                           (DdNode *)
                           ((ulong)(string[uVar6] != '\x01') ^
                           (ulong)dd->vars[iVar4 + p->nTruePis + iVar8]));
      Cudd_Ref(pDVar5);
      Cudd_RecursiveDeref(dd,pDVar10);
      iVar8 = iVar8 + 1;
      iVar4 = p->nRegs;
      pDVar10 = pDVar5;
    } while (iVar8 < iVar4);
  }
  lVar7 = (long)vOnionRings->nSize;
  if (0 < lVar7) {
    if (vOnionRings->nSize <= vOnionRings->nSize) {
      iVar3 = iVar3 - iVar2;
      do {
        pDVar10 = (DdNode *)vOnionRings->pArray[lVar7 + -1];
        n = Bbr_bddImageCompute(pTree,pDVar5);
        if (n == (DdNode *)0x0) {
          Cudd_RecursiveDeref(dd,pDVar5);
          if (fSilent == 0) {
            printf("BDDs blew up during image computation.  ");
          }
          Bbr_bddImageTreeDelete(pTree);
          if (string == (char *)0x0) {
            return (Abc_Cex_t *)0x0;
          }
          free(string);
          return (Abc_Cex_t *)0x0;
        }
        Cudd_Ref(n);
        Cudd_RecursiveDeref(dd,pDVar5);
        pDVar5 = Cudd_bddAnd(dd,n,pDVar10);
        Cudd_Ref(pDVar5);
        Cudd_RecursiveDeref(dd,n);
        iVar2 = Cudd_bddPickOneCube(dd,pDVar5,string);
        if (iVar2 == 0) {
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/bbr/bbrCex.c"
                        ,0x7b,
                        "Abc_Cex_t *Aig_ManVerifyUsingBddsCountExample(Aig_Man_t *, DdManager *, DdNode **, Vec_Ptr_t *, DdNode *, int, int, int)"
                       );
        }
        Cudd_RecursiveDeref(dd,pDVar5);
        iVar2 = p->nTruePis;
        if (0 < iVar2) {
          pVVar1 = p->vCis;
          lVar9 = 0;
          do {
            if (pVVar1->nSize <= lVar9) goto LAB_00920ac6;
            if (string[lVar9] == '\x01') {
              iVar2 = iVar3 + (int)lVar9;
              (&p_00[1].iPo)[iVar2 >> 5] = (&p_00[1].iPo)[iVar2 >> 5] | 1 << ((byte)iVar2 & 0x1f);
            }
            lVar9 = lVar9 + 1;
            iVar2 = p->nTruePis;
          } while (lVar9 < iVar2);
        }
        lVar7 = lVar7 + -1;
        if (lVar7 == 0) {
          lVar7 = (long)p->nRegs;
          if (lVar7 < 1) goto LAB_00920b59;
          lVar9 = (long)iVar2;
          goto LAB_00920b35;
        }
        pDVar5 = dd->one;
        Cudd_Ref(pDVar5);
        iVar4 = p->nRegs;
        if (0 < iVar4) {
          iVar8 = 0;
          pDVar10 = pDVar5;
          do {
            uVar6 = iVar8 + p->nTruePis;
            if (((int)uVar6 < 0) || (p->vCis->nSize <= (int)uVar6)) goto LAB_00920ac6;
            pDVar5 = Cudd_bddAnd(dd,pDVar10,
                                 (DdNode *)
                                 ((ulong)(string[uVar6] != '\x01') ^
                                 (ulong)dd->vars[iVar4 + p->nTruePis + iVar8]));
            Cudd_Ref(pDVar5);
            Cudd_RecursiveDeref(dd,pDVar10);
            iVar8 = iVar8 + 1;
            iVar4 = p->nRegs;
            pDVar10 = pDVar5;
          } while (iVar8 < iVar4);
        }
        iVar3 = iVar3 - iVar2;
      } while (lVar7 <= vOnionRings->nSize);
    }
LAB_00920ac6:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
LAB_00920b59:
  Bbr_bddImageTreeDelete(pTree);
  iVar2 = (int)pTree;
  if (string != (char *)0x0) {
    free(string);
    iVar2 = (int)string;
  }
  if (vOnionRings->nSize < 1000) {
    iVar3 = Saig_ManVerifyCex(p,p_00);
    iVar2 = (int)p;
    if (iVar3 == 0 && fSilent == 0) {
      iVar2 = 0xabe31a;
      puts("Aig_ManVerifyUsingBdds(): Counter-example verification has FAILED.");
    }
  }
  if (fSilent == 0 && fVerbose != 0) {
    Abc_Print(iVar2,"%s =","Counter-example generation time");
    iVar3 = 3;
    iVar2 = clock_gettime(3,(timespec *)&ts);
    if (iVar2 < 0) {
      lVar7 = -1;
    }
    else {
      lVar7 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    Abc_Print(iVar3,"%9.2f sec\n",(double)(lVar7 + local_50) / 1000000.0);
  }
  return p_00;
  while( true ) {
    if (string[lVar9] != '\0') {
      __assert_fail("pValues[Saig_ManPiNum(p)+i] == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/bbr/bbrCex.c"
                    ,0x88,
                    "Abc_Cex_t *Aig_ManVerifyUsingBddsCountExample(Aig_Man_t *, DdManager *, DdNode **, Vec_Ptr_t *, DdNode *, int, int, int)"
                   );
    }
    lVar9 = lVar9 + 1;
    lVar7 = lVar7 + -1;
    if (lVar7 == 0) break;
LAB_00920b35:
    if ((iVar2 < 0) || (p->vCis->nSize <= lVar9)) goto LAB_00920ac6;
  }
  goto LAB_00920b59;
}

Assistant:

Abc_Cex_t * Aig_ManVerifyUsingBddsCountExample( Aig_Man_t * p, DdManager * dd, 
    DdNode ** pbParts, Vec_Ptr_t * vOnionRings, DdNode * bCubeFirst,
    int iOutput, int fVerbose, int fSilent )
{
    Abc_Cex_t * pCex;
    Aig_Obj_t * pObj;
    Bbr_ImageTree_t * pTree;
    DdNode * bCubeNs, * bState, * bImage;
    DdNode * bTemp, * bVar, * bRing;
    int i, v, RetValue, nPiOffset;
    char * pValues;
    abctime clk = Abc_Clock();
//printf( "\nDeriving counter-example.\n" );

    // allocate room for the counter-example
    pCex = Abc_CexAlloc( Saig_ManRegNum(p), Saig_ManPiNum(p), Vec_PtrSize(vOnionRings)+1 );
    pCex->iFrame = Vec_PtrSize(vOnionRings);
    pCex->iPo = iOutput;
    nPiOffset = Saig_ManRegNum(p) + Saig_ManPiNum(p) * Vec_PtrSize(vOnionRings);

    // create the cube of NS variables
    bCubeNs  = Bbr_bddComputeRangeCube( dd, Saig_ManCiNum(p), Saig_ManCiNum(p)+Saig_ManRegNum(p) );    Cudd_Ref( bCubeNs );
    pTree = Bbr_bddImageStart( dd, bCubeNs, Saig_ManRegNum(p), pbParts, Saig_ManCiNum(p), dd->vars, 100000000, fVerbose );
    Cudd_RecursiveDeref( dd, bCubeNs );
    if ( pTree == NULL )
    {
        if ( !fSilent )
            printf( "BDDs blew up during qualitification scheduling.  " );
        return NULL;
    }

    // allocate room for the cube
    pValues = ABC_ALLOC( char, dd->size );

    // get the last cube
    RetValue = Cudd_bddPickOneCube( dd, bCubeFirst, pValues );
    assert( RetValue );

    // write PIs of counter-example
    Saig_ManForEachPi( p, pObj, i )
        if ( pValues[i] == 1 )
            Abc_InfoSetBit( pCex->pData, nPiOffset + i );
    nPiOffset -= Saig_ManPiNum(p);

    // write state in terms of NS variables
    bState = (dd)->one; Cudd_Ref( bState );
    Saig_ManForEachLo( p, pObj, i )
    {
        bVar = Cudd_NotCond( dd->vars[Saig_ManCiNum(p)+i], pValues[Saig_ManPiNum(p)+i] != 1 );
        bState = Cudd_bddAnd( dd, bTemp = bState, bVar );  Cudd_Ref( bState );
        Cudd_RecursiveDeref( dd, bTemp ); 
    }

    // perform backward analysis
    Vec_PtrForEachEntryReverse( DdNode *, vOnionRings, bRing, v )
    { 
        // compute the next states
        bImage = Bbr_bddImageCompute( pTree, bState );           
        if ( bImage == NULL )
        {
            Cudd_RecursiveDeref( dd, bState );
            if ( !fSilent )
                printf( "BDDs blew up during image computation.  " );
            Bbr_bddImageTreeDelete( pTree );
            ABC_FREE( pValues );
            return NULL;
        }
        Cudd_Ref( bImage );
        Cudd_RecursiveDeref( dd, bState );

        // intersect with the previous set
        bImage = Cudd_bddAnd( dd, bTemp = bImage, bRing );  Cudd_Ref( bImage );
        Cudd_RecursiveDeref( dd, bTemp );

        // find any assignment of the BDD
        RetValue = Cudd_bddPickOneCube( dd, bImage, pValues );
        assert( RetValue );
        Cudd_RecursiveDeref( dd, bImage );

        // write PIs of counter-example
        Saig_ManForEachPi( p, pObj, i )
            if ( pValues[i] == 1 )
                Abc_InfoSetBit( pCex->pData, nPiOffset + i );
        nPiOffset -= Saig_ManPiNum(p);

        // check that we get the init state
        if ( v == 0 )
        {
            Saig_ManForEachLo( p, pObj, i )
                assert( pValues[Saig_ManPiNum(p)+i] == 0 );
            break;
        }

        // write state in terms of NS variables
        bState = (dd)->one; Cudd_Ref( bState );
        Saig_ManForEachLo( p, pObj, i )
        {
            bVar = Cudd_NotCond( dd->vars[Saig_ManCiNum(p)+i], pValues[Saig_ManPiNum(p)+i] != 1 );
            bState = Cudd_bddAnd( dd, bTemp = bState, bVar );  Cudd_Ref( bState );
            Cudd_RecursiveDeref( dd, bTemp ); 
        }
    }
    // cleanup
    Bbr_bddImageTreeDelete( pTree );
    ABC_FREE( pValues );
    // verify the counter example
    if ( Vec_PtrSize(vOnionRings) < 1000 )
    {
    RetValue = Saig_ManVerifyCex( p, pCex );
    if ( RetValue == 0 && !fSilent )
        printf( "Aig_ManVerifyUsingBdds(): Counter-example verification has FAILED.\n" );
    }
    if ( fVerbose && !fSilent )
    {
    ABC_PRT( "Counter-example generation time", Abc_Clock() - clk );
    }
    return pCex;
}